

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start_stop_test.cpp
# Opt level: O1

int main(void)

{
  thread_pool pool;
  thread_pool local_d0 [40];
  condition_variable local_a8 [48];
  void *local_78;
  long local_68;
  _Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  local_60 [88];
  
  nonstd::thread_pool::thread_pool(local_d0,0xe);
  nonstd::thread_pool::start();
  nonstd::thread_pool::stop();
  std::
  _Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>::
  ~_Deque_base(local_60);
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  std::condition_variable::~condition_variable(local_a8);
  return 0;
}

Assistant:

int main()
{
   nonstd::thread_pool pool(14);
   pool.start();

   pool.stop();

   return 0;
}